

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockIterator.hpp
# Opt level: O2

bool __thiscall
gmlc::containers::BlockIterator<helics::FedInfo_const,32,helics::FedInfo_const*const*>::
checkEquivalence<helics::FedInfo**>
          (BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*> *this,
          FedInfo **testv,int testoffset)

{
  FedInfo **ppFVar1;
  
  ppFVar1 = this->vec;
  if ((ppFVar1 != testv) &&
     ((((testv == (FedInfo **)0x0 || (ppFVar1 == (FedInfo **)0x0)) || (*testv != (FedInfo *)0x0)) ||
      (*ppFVar1 != (FedInfo *)0x0)))) {
    return false;
  }
  return this->offset == testoffset;
}

Assistant:

bool checkEquivalence(OUTER2 testv, int testoffset) const
        {
            return (
                (testv == vec ||
                 ((testv != nullptr && *testv == nullptr) &&
                  (vec != nullptr && *vec == nullptr))) &&
                testoffset == offset);
        }